

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_traits.hpp
# Opt level: O0

compiler_token_type __thiscall
boost::xpressive::
compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>::
get_group_type<char_const*>
          (compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
           *this,char **begin,char *end,string_type *name)

{
  int iVar1;
  char **ppcVar2;
  char *in_RDX;
  long *in_RSI;
  char *in_stack_fffffffffffffe70;
  string_type *in_stack_fffffffffffffe78;
  source_location *this_00;
  compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
  *in_stack_fffffffffffffe80;
  regex_error *e;
  char **in_stack_fffffffffffffe88;
  error_type code;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  source_location local_140;
  unsigned_long in_stack_fffffffffffffee0;
  char *in_stack_fffffffffffffee8;
  char *in_stack_fffffffffffffef0;
  char *in_stack_fffffffffffffef8;
  error_type in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  undefined1 cond;
  compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
  *in_stack_ffffffffffffff08;
  source_location local_e8;
  regex_error local_d0;
  source_location local_80 [4];
  char *local_20;
  long *local_18;
  compiler_token_type local_4;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  ppcVar2 = eat_ws_<char_const*>
                      (in_stack_fffffffffffffe80,(char **)in_stack_fffffffffffffe78,
                       in_stack_fffffffffffffe70);
  if ((*ppcVar2 == local_20) || (*(char *)*local_18 != '?')) {
    local_4 = token_literal;
  }
  else {
    *local_18 = *local_18 + 1;
    eat_ws_<char_const*>
              (in_stack_fffffffffffffe80,(char **)in_stack_fffffffffffffe78,
               in_stack_fffffffffffffe70);
    detail::ensure_(SUB41((uint)in_stack_ffffffffffffff04 >> 0x18,0),in_stack_ffffffffffffff00,
                    in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                    in_stack_fffffffffffffee0);
    switch(*(undefined1 *)*local_18) {
    case 0x21:
      *local_18 = *local_18 + 1;
      local_4 = token_negative_lookahead;
      break;
    default:
      regex_error::regex_error
                ((regex_error *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                 (error_type)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                 (char *)in_stack_fffffffffffffe80);
      this_00 = &local_140;
      source_location::source_location
                (this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O0/KWStyle/Utilities/boost/xpressive/detail/dynamic/parser_traits.hpp"
                 ,0x118,
                 "regex_constants::compiler_token_type boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char>>::get_group_type(FwdIter &, FwdIter, string_type &) [RegexTraits = boost::xpressive::regex_traits<char>, FwdIter = const char *]"
                 ,0);
      throw_exception<boost::xpressive::regex_error>
                ((regex_error *)in_stack_fffffffffffffe80,this_00);
    case 0x23:
      *local_18 = *local_18 + 1;
      local_4 = token_comment;
      break;
    case 0x24:
      *local_18 = *local_18 + 1;
      get_name_<char_const*>
                ((compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
                  *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                 in_stack_fffffffffffffe88,(char *)in_stack_fffffffffffffe80,
                 in_stack_fffffffffffffe78);
      detail::ensure_(SUB41((uint)in_stack_ffffffffffffff04 >> 0x18,0),in_stack_ffffffffffffff00,
                      in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                      in_stack_fffffffffffffee0);
      if (*(char *)*local_18 == '=') {
        *local_18 = *local_18 + 1;
        local_4 = token_rule_assign;
      }
      else {
        local_4 = token_rule_ref;
      }
      break;
    case 0x2d:
    case 0x69:
    case 0x6d:
    case 0x73:
    case 0x78:
      local_4 = parse_mods_<char_const*>
                          (in_stack_ffffffffffffff08,
                           (char **)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                           in_stack_fffffffffffffef8);
      break;
    case 0x3a:
      *local_18 = *local_18 + 1;
      local_4 = token_no_mark;
      break;
    case 0x3c:
      *local_18 = *local_18 + 1;
      eat_ws_<char_const*>
                (in_stack_fffffffffffffe80,(char **)in_stack_fffffffffffffe78,
                 in_stack_fffffffffffffe70);
      code = (error_type)((ulong)in_stack_fffffffffffffe88 >> 0x20);
      detail::ensure_(SUB41((uint)in_stack_ffffffffffffff04 >> 0x18,0),in_stack_ffffffffffffff00,
                      in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                      in_stack_fffffffffffffee0);
      if (*(char *)*local_18 == '!') {
        *local_18 = *local_18 + 1;
        local_4 = token_negative_lookbehind;
      }
      else {
        if (*(char *)*local_18 != '=') {
          regex_error::regex_error
                    ((regex_error *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                     code,(char *)in_stack_fffffffffffffe80);
          source_location::source_location
                    (local_80,
                     "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O0/KWStyle/Utilities/boost/xpressive/detail/dynamic/parser_traits.hpp"
                     ,0xfc,
                     "regex_constants::compiler_token_type boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char>>::get_group_type(FwdIter &, FwdIter, string_type &) [RegexTraits = boost::xpressive::regex_traits<char>, FwdIter = const char *]"
                     ,0);
          throw_exception<boost::xpressive::regex_error>
                    ((regex_error *)in_stack_fffffffffffffe80,
                     (source_location *)in_stack_fffffffffffffe78);
        }
        *local_18 = *local_18 + 1;
        local_4 = token_positive_lookbehind;
      }
      break;
    case 0x3d:
      *local_18 = *local_18 + 1;
      local_4 = token_positive_lookahead;
      break;
    case 0x3e:
      *local_18 = *local_18 + 1;
      local_4 = token_independent_sub_expression;
      break;
    case 0x50:
      *local_18 = *local_18 + 1;
      eat_ws_<char_const*>
                (in_stack_fffffffffffffe80,(char **)in_stack_fffffffffffffe78,
                 in_stack_fffffffffffffe70);
      cond = (undefined1)((uint)in_stack_ffffffffffffff04 >> 0x18);
      detail::ensure_((bool)cond,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                      in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0)
      ;
      iVar1 = (int)*(char *)*local_18;
      if (iVar1 == 0x3c) {
        *local_18 = *local_18 + 1;
        get_name_<char_const*>
                  ((compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
                    *)CONCAT44(0x3c,in_stack_fffffffffffffe90),in_stack_fffffffffffffe88,
                   (char *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
        if ((char *)*local_18 != local_20) {
          *local_18 = *local_18 + 1;
        }
        detail::ensure_((bool)cond,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                        in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                        in_stack_fffffffffffffee0);
        local_4 = token_named_mark;
      }
      else {
        if (iVar1 != 0x3d) {
          e = &local_d0;
          regex_error::regex_error
                    ((regex_error *)CONCAT44(iVar1,in_stack_fffffffffffffe90),
                     (error_type)((ulong)in_stack_fffffffffffffe88 >> 0x20),(char *)e);
          source_location::source_location
                    (&local_e8,
                     "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O0/KWStyle/Utilities/boost/xpressive/detail/dynamic/parser_traits.hpp"
                     ,0x10d,
                     "regex_constants::compiler_token_type boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char>>::get_group_type(FwdIter &, FwdIter, string_type &) [RegexTraits = boost::xpressive::regex_traits<char>, FwdIter = const char *]"
                     ,0);
          throw_exception<boost::xpressive::regex_error>
                    (e,(source_location *)in_stack_fffffffffffffe78);
        }
        *local_18 = *local_18 + 1;
        get_name_<char_const*>
                  ((compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
                    *)CONCAT44(0x3d,in_stack_fffffffffffffe90),in_stack_fffffffffffffe88,
                   (char *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
        detail::ensure_((bool)cond,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                        in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                        in_stack_fffffffffffffee0);
        local_4 = token_named_mark_ref;
      }
      break;
    case 0x52:
      *local_18 = *local_18 + 1;
      local_4 = token_recurse;
    }
  }
  return local_4;
}

Assistant:

regex_constants::compiler_token_type get_group_type(FwdIter &begin, FwdIter end, string_type &name)
    {
        using namespace regex_constants;
        if(this->eat_ws_(begin, end) != end && BOOST_XPR_CHAR_(char_type, '?') == *begin)
        {
            this->eat_ws_(++begin, end);
            BOOST_XPR_ENSURE_(begin != end, error_paren, "incomplete extension");

            switch(*begin)
            {
            case BOOST_XPR_CHAR_(char_type, ':'): ++begin; return token_no_mark;
            case BOOST_XPR_CHAR_(char_type, '>'): ++begin; return token_independent_sub_expression;
            case BOOST_XPR_CHAR_(char_type, '#'): ++begin; return token_comment;
            case BOOST_XPR_CHAR_(char_type, '='): ++begin; return token_positive_lookahead;
            case BOOST_XPR_CHAR_(char_type, '!'): ++begin; return token_negative_lookahead;
            case BOOST_XPR_CHAR_(char_type, 'R'): ++begin; return token_recurse;
            case BOOST_XPR_CHAR_(char_type, '$'):
                this->get_name_(++begin, end, name);
                BOOST_XPR_ENSURE_(begin != end, error_paren, "incomplete extension");
                if(BOOST_XPR_CHAR_(char_type, '=') == *begin)
                {
                    ++begin;
                    return token_rule_assign;
                }
                return token_rule_ref;

            case BOOST_XPR_CHAR_(char_type, '<'):
                this->eat_ws_(++begin, end);
                BOOST_XPR_ENSURE_(begin != end, error_paren, "incomplete extension");
                switch(*begin)
                {
                case BOOST_XPR_CHAR_(char_type, '='): ++begin; return token_positive_lookbehind;
                case BOOST_XPR_CHAR_(char_type, '!'): ++begin; return token_negative_lookbehind;
                default:
                    BOOST_THROW_EXCEPTION(regex_error(error_badbrace, "unrecognized extension"));
                }

            case BOOST_XPR_CHAR_(char_type, 'P'):
                this->eat_ws_(++begin, end);
                BOOST_XPR_ENSURE_(begin != end, error_paren, "incomplete extension");
                switch(*begin)
                {
                case BOOST_XPR_CHAR_(char_type, '<'):
                    this->get_name_(++begin, end, name);
                    BOOST_XPR_ENSURE_(begin != end && BOOST_XPR_CHAR_(char_type, '>') == *begin++, error_paren, "incomplete extension");
                    return token_named_mark;
                case BOOST_XPR_CHAR_(char_type, '='):
                    this->get_name_(++begin, end, name);
                    BOOST_XPR_ENSURE_(begin != end, error_paren, "incomplete extension");
                    return token_named_mark_ref;
                default:
                    BOOST_THROW_EXCEPTION(regex_error(error_badbrace, "unrecognized extension"));
                }

            case BOOST_XPR_CHAR_(char_type, 'i'):
            case BOOST_XPR_CHAR_(char_type, 'm'):
            case BOOST_XPR_CHAR_(char_type, 's'):
            case BOOST_XPR_CHAR_(char_type, 'x'):
            case BOOST_XPR_CHAR_(char_type, '-'):
                return this->parse_mods_(begin, end);

            default:
                BOOST_THROW_EXCEPTION(regex_error(error_badbrace, "unrecognized extension"));
            }
        }

        return token_literal;
    }